

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O0

void __thiscall
google::protobuf::util::MessageDifferencer::StreamReporter::~StreamReporter(StreamReporter *this)

{
  StreamReporter *this_local;
  
  ~StreamReporter(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

MessageDifferencer::StreamReporter::~StreamReporter() {
  if (delete_printer_) delete printer_;
}